

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterCb(void *pCtx,int tflags,char *pToken,int nToken,int iStart,int iEnd)

{
  char c_00;
  int iVar1;
  int local_4c;
  char c;
  char *pcStack_48;
  int nBuf;
  char *aBuf;
  PorterContext *p;
  int local_30;
  int iEnd_local;
  int iStart_local;
  int nToken_local;
  char *pToken_local;
  void *pvStack_18;
  int tflags_local;
  void *pCtx_local;
  
  aBuf = (char *)pCtx;
  p._4_4_ = iEnd;
  local_30 = iStart;
  iEnd_local = nToken;
  _iStart_local = pToken;
  pToken_local._4_4_ = tflags;
  pvStack_18 = pCtx;
  if ((nToken < 0x41) && (2 < nToken)) {
    pcStack_48 = *(char **)((long)pCtx + 0x10);
    local_4c = nToken;
    memcpy(pcStack_48,pToken,(long)nToken);
    fts5PorterStep1A(pcStack_48,&local_4c);
    iVar1 = fts5PorterStep1B(pcStack_48,&local_4c);
    if ((iVar1 != 0) && (iVar1 = fts5PorterStep1B2(pcStack_48,&local_4c), iVar1 == 0)) {
      c_00 = pcStack_48[local_4c + -1];
      iVar1 = fts5PorterIsVowel(c_00,0);
      if (((iVar1 == 0) && (((c_00 != 'l' && (c_00 != 's')) && (c_00 != 'z')))) &&
         (c_00 == pcStack_48[local_4c + -2])) {
        local_4c = local_4c + -1;
      }
      else {
        iVar1 = fts5Porter_MEq1(pcStack_48,local_4c);
        if ((iVar1 != 0) && (iVar1 = fts5Porter_Ostar(pcStack_48,local_4c), iVar1 != 0)) {
          pcStack_48[local_4c] = 'e';
          local_4c = local_4c + 1;
        }
      }
    }
    if ((pcStack_48[local_4c + -1] == 'y') &&
       (iVar1 = fts5Porter_Vowel(pcStack_48,local_4c + -1), iVar1 != 0)) {
      pcStack_48[local_4c + -1] = 'i';
    }
    fts5PorterStep2(pcStack_48,&local_4c);
    fts5PorterStep3(pcStack_48,&local_4c);
    fts5PorterStep4(pcStack_48,&local_4c);
    if ((pcStack_48[local_4c + -1] == 'e') &&
       ((iVar1 = fts5Porter_MGt1(pcStack_48,local_4c + -1), iVar1 != 0 ||
        ((iVar1 = fts5Porter_MEq1(pcStack_48,local_4c + -1), iVar1 != 0 &&
         (iVar1 = fts5Porter_Ostar(pcStack_48,local_4c + -1), iVar1 == 0)))))) {
      local_4c = local_4c + -1;
    }
    if ((((1 < local_4c) && (pcStack_48[local_4c + -1] == 'l')) &&
        (pcStack_48[local_4c + -2] == 'l')) &&
       (iVar1 = fts5Porter_MGt1(pcStack_48,local_4c + -1), iVar1 != 0)) {
      local_4c = local_4c + -1;
    }
    pCtx_local._4_4_ =
         (**(code **)(aBuf + 8))
                   (*(undefined8 *)aBuf,pToken_local._4_4_,pcStack_48,local_4c,local_30,p._4_4_);
  }
  else {
    pCtx_local._4_4_ = (**(code **)((long)pCtx + 8))(*pCtx,tflags,pToken,nToken,iStart,iEnd);
  }
  return pCtx_local._4_4_;
}

Assistant:

static int fts5PorterCb(
  void *pCtx, 
  int tflags,
  const char *pToken, 
  int nToken, 
  int iStart, 
  int iEnd
){
  PorterContext *p = (PorterContext*)pCtx;

  char *aBuf;
  int nBuf;

  if( nToken>FTS5_PORTER_MAX_TOKEN || nToken<3 ) goto pass_through;
  aBuf = p->aBuf;
  nBuf = nToken;
  memcpy(aBuf, pToken, nBuf);

  /* Step 1. */
  fts5PorterStep1A(aBuf, &nBuf);
  if( fts5PorterStep1B(aBuf, &nBuf) ){
    if( fts5PorterStep1B2(aBuf, &nBuf)==0 ){
      char c = aBuf[nBuf-1];
      if( fts5PorterIsVowel(c, 0)==0 
       && c!='l' && c!='s' && c!='z' && c==aBuf[nBuf-2] 
      ){
        nBuf--;
      }else if( fts5Porter_MEq1(aBuf, nBuf) && fts5Porter_Ostar(aBuf, nBuf) ){
        aBuf[nBuf++] = 'e';
      }
    }
  }

  /* Step 1C. */
  if( aBuf[nBuf-1]=='y' && fts5Porter_Vowel(aBuf, nBuf-1) ){
    aBuf[nBuf-1] = 'i';
  }

  /* Steps 2 through 4. */
  fts5PorterStep2(aBuf, &nBuf);
  fts5PorterStep3(aBuf, &nBuf);
  fts5PorterStep4(aBuf, &nBuf);

  /* Step 5a. */
  assert( nBuf>0 );
  if( aBuf[nBuf-1]=='e' ){
    if( fts5Porter_MGt1(aBuf, nBuf-1) 
     || (fts5Porter_MEq1(aBuf, nBuf-1) && !fts5Porter_Ostar(aBuf, nBuf-1))
    ){
      nBuf--;
    }
  }

  /* Step 5b. */
  if( nBuf>1 && aBuf[nBuf-1]=='l' 
   && aBuf[nBuf-2]=='l' && fts5Porter_MGt1(aBuf, nBuf-1) 
  ){
    nBuf--;
  }

  return p->xToken(p->pCtx, tflags, aBuf, nBuf, iStart, iEnd);

 pass_through:
  return p->xToken(p->pCtx, tflags, pToken, nToken, iStart, iEnd);
}